

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovContext.cpp
# Opt level: O0

cl_context
cov::createContext(cl_context_properties *properties,cl_uint numDevices,cl_device_id *devices,
                  contextCallback pfnNotify,void *userData,cl_int *errcodeRet)

{
  Device *args;
  bool bVar1;
  Countable<cov::Context> *this;
  Countable<cov::Context> *local_80;
  Context *c;
  Countable<cov::Context> *context;
  Device *d;
  cl_int *errcodeRet_local;
  void *userData_local;
  contextCallback pfnNotify_local;
  cl_device_id *devices_local;
  cl_context_properties *pcStack_18;
  cl_uint numDevices_local;
  cl_context_properties *properties_local;
  
  if (numDevices == 1) {
    args = (Device *)*devices;
    errcodeRet_local = (cl_int *)userData;
    userData_local = pfnNotify;
    pfnNotify_local = (contextCallback)devices;
    devices_local._4_4_ = numDevices;
    pcStack_18 = properties;
    this = (Countable<cov::Context> *)operator_new(0x40,(nothrow_t *)&std::nothrow);
    local_80 = (Countable<cov::Context> *)0x0;
    if (this != (Countable<cov::Context> *)0x0) {
      Countable<cov::Context>::
      Countable<cov::Device_const,void(*)(char_const*,void_const*,unsigned_long,void*),void*>
                (this,args,(_func_void_char_ptr_void_ptr_unsigned_long_void_ptr **)&userData_local,
                 &errcodeRet_local);
      local_80 = this;
    }
    if (local_80 == (Countable<cov::Context> *)0x0) {
      *errcodeRet = -6;
      properties_local = (cl_context_properties *)0x0;
    }
    else {
      bVar1 = ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>::initSuccess
                        ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4> *)local_80);
      if (bVar1) {
        *errcodeRet = 0;
        properties_local = (cl_context_properties *)local_80;
      }
      else {
        ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>::release
                  ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4> *)local_80);
        *errcodeRet = -5;
        properties_local = (cl_context_properties *)0x0;
      }
    }
  }
  else {
    *errcodeRet = -2;
    properties_local = (cl_context_properties *)0x0;
  }
  return (cl_context)properties_local;
}

Assistant:

cl_context createContext(const cl_context_properties* properties,
                         cl_uint numDevices,
                         const cl_device_id* devices,
                         contextCallback pfnNotify,
                         void* userData,
                         cl_int* errcodeRet)
{
    (void)properties; // current not used

    if (numDevices != 1) {
        // only support one device
        *errcodeRet = CL_DEVICE_NOT_AVAILABLE;
        return nullptr;
    }

    auto d = reinterpret_cast<const Device*>(devices[0]);
    auto context = new(std::nothrow) Countable<Context>(*d, pfnNotify, userData);
    if (!context) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto c = reinterpret_cast<Context*>(context);
    if (!c->initSuccess()) {
        c->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_context*>(c);
}